

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageColor(Image *__return_storage_ptr__,int width,int height,Color color)

{
  void *pvVar1;
  int local_24;
  int i;
  Color *pixels;
  int height_local;
  int width_local;
  Color color_local;
  
  pvVar1 = calloc((long)(width * height),4);
  for (local_24 = 0; local_24 < width * height; local_24 = local_24 + 1) {
    *(Color *)((long)pvVar1 + (long)local_24 * 4) = color;
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageColor(int width, int height, Color color)
{
    Color *pixels = (Color *)RL_CALLOC(width*height, sizeof(Color));

    for (int i = 0; i < width*height; i++) pixels[i] = color;

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}